

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O0

void __thiscall backend::codegen::RegAllocator::display_active_regs(RegAllocator *this)

{
  bool bVar1;
  ostream *__a;
  Function *this_00;
  ostream *poVar2;
  reference ppVar3;
  ostream *poVar4;
  reference ppVar5;
  long in_RDI;
  pair<unsigned_int,_unsigned_int> x_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range2_1;
  pair<const_unsigned_int,_backend::codegen::Interval> x;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
  *__range2;
  ostream *trace;
  size_t in_stack_fffffffffffffe58;
  Function *this_01;
  string *name;
  Function *function;
  ostream *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  uint uVar6;
  _Self in_stack_fffffffffffffea0;
  _Self local_158;
  long local_150;
  undefined8 local_144;
  uint local_13c;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_138;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_130;
  long local_128;
  allocator<char> local_119;
  Timestamp *in_stack_fffffffffffffee8;
  ostream *in_stack_fffffffffffffef0;
  undefined1 local_f1 [73];
  Severity *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff60;
  time_point_sys_clock local_78;
  Timestamp local_70;
  undefined1 local_11;
  undefined8 local_10;
  
  local_11 = 0;
  AixLog::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  function = (Function *)&stack0xffffffffffffffb8;
  AixLog::Tag::Tag((Tag *)0x244ebf);
  __a = AixLog::operator<<(in_stack_fffffffffffffe90,(Tag *)function);
  local_78.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(&local_70,&local_78);
  this_00 = (Function *)AixLog::operator<<(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  name = (string *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0._M_node,in_stack_fffffffffffffe98,(allocator<char> *)__a);
  this_01 = (Function *)&local_119;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0._M_node,in_stack_fffffffffffffe98,(allocator<char> *)__a);
  AixLog::Function::Function(this_00,name,(string *)this_01,in_stack_fffffffffffffe58);
  poVar2 = AixLog::operator<<(__a,function);
  AixLog::Function::~Function(this_01);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  AixLog::Timestamp::~Timestamp(&local_70);
  AixLog::Tag::~Tag((Tag *)0x245003);
  local_10 = poVar2;
  std::operator<<(poVar2,"active: ");
  local_128 = in_RDI + 0x188;
  local_130._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
       ::begin((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                *)poVar2);
  local_138._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
       ::end((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
              *)poVar2);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_130,&local_138);
    if (!bVar1) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
             ::operator*((_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
                          *)0x24507c);
    local_144._0_4_ = ppVar3->first;
    local_144._4_4_ = (ppVar3->second).start;
    local_13c = (ppVar3->second).end;
    poVar4 = (ostream *)std::ostream::operator<<((void *)local_10,(undefined4)local_144);
    poVar4 = std::operator<<(poVar4,"->[");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_144._4_4_);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_13c);
    poVar4 = std::operator<<(poVar4,"]");
    std::operator<<(poVar4,"; ");
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
                *)this_01);
  }
  std::ostream::operator<<((void *)local_10,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)local_10,"map: ");
  local_150 = in_RDI + 0x1c0;
  local_158._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ::begin((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)poVar2);
  std::__cxx11::
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::end((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         *)poVar2);
  while( true ) {
    bVar1 = std::operator!=(&local_158,(_Self *)&stack0xfffffffffffffea0);
    if (!bVar1) break;
    ppVar5 = std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator*
                       ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)0x24525c);
    uVar6 = (*ppVar5).second;
    arm::display_reg_name(__a,(Reg)((ulong)function >> 0x20));
    poVar2 = std::operator<<((ostream *)local_10,"->");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar6);
    std::operator<<(poVar2,"; ");
    std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator++(&local_158);
  }
  std::ostream::operator<<((void *)local_10,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void display_active_regs() {
    auto &trace = LOG(TRACE);
    trace << "active: ";
    for (auto x : active) {
      trace << x.first << "->[" << x.second.start << "," << x.second.end << "]"
            << "; ";
    }
    trace << std::endl;
    trace << "map: ";
    for (auto x : active_reg_map) {
      display_reg_name(trace, x.first);
      trace << "->" << x.second << "; ";
    }
    trace << std::endl;
  }